

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cpp
# Opt level: O0

void __thiscall log_test_DefaultConstructor_Test::TestBody(log_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  AssertionResult gtest_ar_34;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  size_t iterator_4;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  size_t iterator_3;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  size_t iterator_2;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  size_t storage_batch_size;
  AssertionResult gtest_ar_6;
  size_t iterator_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  uint value_1;
  void *value_ptr_1;
  char *key;
  AssertionResult gtest_ar_3;
  uint value;
  void *value_ptr;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  log_map map;
  log_map_iterator map_iterator;
  size_t iterator;
  size_t log_name_list_size;
  log_name_list_type log_name_list [10];
  log_map_type **in_stack_fffffffffffff490;
  log_map_type **in_stack_fffffffffffff498;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff4a0;
  undefined1 in_stack_fffffffffffff4a7;
  char *in_stack_fffffffffffff4a8;
  AssertHelper local_6b0;
  Message local_6a8;
  undefined4 local_6a0;
  undefined4 local_69c;
  AssertionResult local_698;
  AssertHelper local_688;
  Message local_680;
  undefined4 local_678;
  undefined4 local_674;
  AssertionResult local_670;
  AssertHelper local_660;
  Message local_658;
  undefined4 local_650;
  undefined4 local_64c;
  AssertionResult local_648;
  AssertHelper local_638;
  Message local_630;
  undefined4 local_628;
  undefined4 local_624;
  AssertionResult local_620;
  AssertHelper local_610;
  Message local_608;
  undefined4 local_600;
  undefined4 local_5fc;
  AssertionResult local_5f8;
  AssertHelper local_5e8;
  Message local_5e0;
  undefined4 local_5d8;
  undefined4 local_5d4;
  AssertionResult local_5d0;
  AssertHelper local_5c0;
  Message local_5b8;
  undefined4 local_5b0;
  undefined4 local_5ac;
  AssertionResult local_5a8;
  AssertHelper local_598;
  Message local_590;
  undefined4 local_588;
  undefined4 local_584;
  AssertionResult local_580;
  AssertHelper local_570;
  Message local_568;
  undefined4 local_560;
  undefined4 local_55c;
  AssertionResult local_558;
  AssertHelper local_548;
  Message local_540;
  undefined4 local_538;
  undefined4 local_534;
  AssertionResult local_530;
  AssertHelper local_520;
  Message local_518;
  undefined4 local_510;
  undefined4 local_50c;
  AssertionResult local_508;
  AssertHelper local_4f8;
  Message local_4f0;
  undefined4 local_4e8;
  undefined4 local_4e4;
  AssertionResult local_4e0;
  AssertHelper local_4d0;
  Message local_4c8;
  undefined4 local_4c0;
  undefined4 local_4bc;
  AssertionResult local_4b8;
  ulong local_4a8;
  AssertHelper local_4a0;
  Message local_498;
  undefined4 local_490;
  undefined4 local_48c;
  AssertionResult local_488;
  AssertHelper local_478;
  Message local_470;
  undefined4 local_468;
  undefined4 local_464;
  AssertionResult local_460;
  AssertHelper local_450;
  Message local_448;
  undefined4 local_440;
  undefined4 local_43c;
  AssertionResult local_438;
  ulong local_428;
  AssertHelper local_420;
  Message local_418;
  undefined4 local_410;
  undefined4 local_40c;
  AssertionResult local_408;
  AssertHelper local_3f8;
  Message local_3f0;
  undefined4 local_3e8;
  undefined4 local_3e4;
  AssertionResult local_3e0;
  ulong local_3d0;
  AssertHelper local_3c8;
  Message local_3c0;
  undefined4 local_3b8;
  undefined4 local_3b4;
  AssertionResult local_3b0;
  AssertHelper local_3a0;
  Message local_398;
  undefined4 local_390;
  undefined4 local_38c;
  AssertionResult local_388;
  AssertHelper local_378;
  Message local_370;
  undefined4 local_368;
  undefined4 local_364;
  AssertionResult local_360;
  AssertHelper local_350;
  Message local_348;
  undefined4 local_340;
  undefined4 local_33c;
  AssertionResult local_338;
  AssertHelper local_328;
  Message local_320;
  undefined4 local_318;
  undefined4 local_314;
  AssertionResult local_310;
  AssertHelper local_300;
  Message local_2f8;
  undefined4 local_2f0;
  undefined4 local_2ec;
  AssertionResult local_2e8;
  AssertHelper local_2d8;
  Message local_2d0;
  undefined4 local_2c8;
  undefined4 local_2c4;
  AssertionResult local_2c0;
  AssertHelper local_2b0;
  Message local_2a8;
  undefined4 local_2a0;
  undefined4 local_29c;
  AssertionResult local_298;
  AssertHelper local_288;
  Message local_280;
  undefined4 local_278;
  undefined4 local_274;
  AssertionResult local_270;
  AssertHelper local_260;
  Message local_258;
  undefined4 local_250;
  undefined4 local_24c;
  AssertionResult local_248;
  undefined8 local_238;
  AssertHelper local_230;
  Message local_228;
  undefined4 local_220;
  undefined4 local_21c;
  AssertionResult local_218;
  ulong local_208;
  AssertHelper local_200;
  Message local_1f8;
  undefined4 local_1f0;
  undefined4 local_1ec;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  int local_1c8;
  undefined4 local_1c4;
  AssertionResult local_1c0;
  uint local_1ac;
  uint *local_1a8;
  char *local_1a0;
  AssertHelper local_198;
  Message local_190;
  undefined4 local_188;
  undefined4 local_184;
  AssertionResult local_180;
  undefined4 local_16c;
  undefined4 *local_168;
  AssertHelper local_160;
  Message local_158;
  undefined8 local_150;
  undefined8 local_148;
  AssertionResult local_140;
  AssertHelper local_130;
  Message local_128;
  undefined4 local_120;
  undefined4 local_11c;
  AssertionResult local_118;
  AssertHelper local_108;
  Message local_100 [3];
  undefined8 local_e8;
  undefined8 local_e0;
  AssertionResult local_d8;
  undefined8 local_c8;
  undefined8 local_c0;
  ulong local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 auStack_a0 [5];
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  memcpy(&local_a8,&PTR_anon_var_dwarf_415b_0018a8e0,0xa0);
  local_b0 = 10;
  local_e8 = log_map_create(0x200);
  local_e0 = 0;
  local_c8 = local_e8;
  testing::internal::CmpHelperNE<log_map_type*,log_map_type*>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             in_stack_fffffffffffff498,in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar1) {
    testing::Message::Message(local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10bb42);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x3e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message((Message *)0x10bba5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bbfd);
  for (local_b8 = 0; local_b8 < 10; local_b8 = local_b8 + 1) {
    local_11c = 0;
    local_120 = log_map_insert(local_c8,auStack_a0[local_b8 * 2 + -1],auStack_a0 + local_b8 * 2);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffff4a8,
               (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
               (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10bcf5);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0x42,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      testing::Message::~Message((Message *)0x10bd58);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bdad);
  }
  local_148 = 10;
  local_150 = log_map_size(local_c8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (unsigned_long *)in_stack_fffffffffffff498,(unsigned_long *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10be89);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x10beec);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bf44);
  for (local_b8 = 0; local_b8 < 10; local_b8 = local_b8 + 1) {
    local_168 = (undefined4 *)log_map_get(local_c8,auStack_a0[local_b8 * 2 + -1]);
    local_188 = *local_168;
    local_184 = *(undefined4 *)(auStack_a0 + local_b8 * 2);
    local_16c = local_188;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              (in_stack_fffffffffffff4a8,
               (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
               (uint *)in_stack_fffffffffffff498,(uint *)in_stack_fffffffffffff490);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10c063);
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0x4d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      testing::Message::~Message((Message *)0x10c0c6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c11b);
  }
  local_c0 = log_map_iterator_begin(local_c8);
  while (iVar2 = log_map_iterator_end(local_c0), iVar2 != 0) {
    local_1a0 = (char *)log_map_iterator_key(local_c0);
    local_1a8 = (uint *)log_map_iterator_value(local_c0);
    local_1ac = *local_1a8;
    local_1c4 = 0;
    local_1c8 = strcmp((char *)auStack_a0[(ulong)local_1ac * 2 + -1],local_1a0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffff4a8,
               (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
               (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
    if (!bVar1) {
      testing::Message::Message(&local_1d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10c26e);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0x58,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      testing::Message::~Message((Message *)0x10c2d1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c326);
    log_map_iterator_next(local_c0);
  }
  local_1ec = log_map_destroy(local_c8);
  local_1f0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10c3f9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message((Message *)0x10c45c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c4b4);
  for (local_208 = 0; local_208 < 10; local_208 = local_208 + 1) {
    local_21c = 0;
    local_220 = log_create(auStack_a0[local_208 * 2 + -1]);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffff4a8,
               (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
               (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_218);
    if (!bVar1) {
      testing::Message::Message(&local_228);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10c59c);
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,100,pcVar3);
      testing::internal::AssertHelper::operator=(&local_230,&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      testing::Message::~Message((Message *)0x10c5ff);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c654);
  }
  local_238 = 0x10;
  local_24c = 0;
  uVar4 = log_policy_format_text();
  uVar5 = log_policy_schedule_sync();
  uVar6 = log_policy_storage_sequential();
  uVar7 = log_policy_stream_stdio(_stdout);
  local_250 = log_configure_impl(local_a8,4,uVar4,uVar5,uVar6,uVar7);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10c7a2);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    testing::Message::~Message((Message *)0x10c805);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c85d);
  local_274 = 0;
  uVar4 = log_policy_format_text();
  uVar5 = log_policy_schedule_sync();
  uVar6 = log_policy_storage_sequential();
  uVar7 = log_policy_stream_stdio(_stderr);
  local_278 = log_configure_impl(auStack_a0[1],4,uVar4,uVar5,uVar6,uVar7);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10c986);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    testing::Message::~Message((Message *)0x10c9e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ca41);
  uVar4 = auStack_a0[3];
  local_29c = 0;
  uVar5 = log_policy_format_text();
  uVar6 = log_policy_schedule_sync();
  uVar7 = log_policy_storage_sequential();
  uVar8 = log_policy_stream_file(auStack_a0[3],"a+");
  local_2a0 = log_configure_impl(uVar4,4,uVar5,uVar6,uVar7,uVar8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10cb6f);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x7c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    testing::Message::~Message((Message *)0x10cbd2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cc2a);
  uVar4 = local_78;
  local_2c4 = 0;
  uVar5 = log_policy_format_text();
  uVar6 = log_policy_schedule_sync();
  uVar7 = log_policy_storage_sequential();
  uVar8 = log_policy_stream_syslog(local_78);
  local_2c8 = log_configure_impl(uVar4,4,uVar5,uVar6,uVar7,uVar8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10cd51);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    testing::Message::~Message((Message *)0x10cdb4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ce0c);
  local_2ec = 0;
  uVar4 = log_policy_format_text();
  uVar5 = log_policy_schedule_sync();
  uVar6 = log_policy_storage_sequential();
  uVar7 = log_policy_stream_socket("127.0.0.1",0x208);
  local_2f0 = log_configure_impl(local_68,4,uVar4,uVar5,uVar6,uVar7);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10cf37);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x88,pcVar3);
    testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    testing::Message::~Message((Message *)0x10cf9a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cff2);
  local_314 = 0;
  uVar4 = log_policy_format_binary();
  uVar5 = log_policy_schedule_async();
  uVar6 = log_policy_storage_batch(0x10);
  uVar7 = log_policy_stream_stdio(_stdout);
  local_318 = log_configure_impl(local_58,4,uVar4,uVar5,uVar6,uVar7);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_310);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10d120);
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    testing::Message::~Message((Message *)0x10d183);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d1db);
  local_33c = 0;
  uVar4 = log_policy_format_binary();
  uVar5 = log_policy_schedule_async();
  uVar6 = log_policy_storage_batch(0x10);
  uVar7 = log_policy_stream_stdio(_stderr);
  local_340 = log_configure_impl(local_48,4,uVar4,uVar5,uVar6,uVar7);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_338);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10d309);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x94,pcVar3);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message((Message *)0x10d36c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d3c4);
  uVar4 = local_38;
  local_364 = 0;
  uVar5 = log_policy_format_binary();
  uVar6 = log_policy_schedule_async();
  uVar7 = log_policy_storage_batch(0x10);
  uVar8 = log_policy_stream_file(local_38,"a+");
  local_368 = log_configure_impl(uVar4,4,uVar5,uVar6,uVar7,uVar8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10d4f7);
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x9a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_378,&local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    testing::Message::~Message((Message *)0x10d55a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d5b2);
  uVar4 = local_28;
  local_38c = 0;
  uVar5 = log_policy_format_binary();
  uVar6 = log_policy_schedule_async();
  uVar7 = log_policy_storage_batch(0x10);
  uVar8 = log_policy_stream_syslog(local_28);
  local_390 = log_configure_impl(uVar4,4,uVar5,uVar6,uVar7,uVar8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_388);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10d6de);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xa0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    testing::Message::~Message((Message *)0x10d741);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d799);
  local_3b4 = 0;
  uVar4 = log_policy_format_binary();
  uVar5 = log_policy_schedule_async();
  uVar6 = log_policy_storage_batch(0x10);
  uVar7 = log_policy_stream_socket("127.0.0.1",0x209);
  local_3b8 = log_configure_impl(local_18,4,uVar4,uVar5,uVar6,uVar7);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10d8c9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xa6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    testing::Message::~Message((Message *)0x10d92c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d984);
  for (local_3d0 = 0; local_3d0 < 10; local_3d0 = local_3d0 + 1) {
    local_3e4 = 0;
    local_3e8 = log_write_impl_va(auStack_a0[local_3d0 * 2 + -1],0xaf,"TestBody",
                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                  ,1,"hello world");
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffff4a8,
               (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
               (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
    if (!bVar1) {
      testing::Message::Message(&local_3f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10da8e);
      testing::internal::AssertHelper::AssertHelper
                (&local_3f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xaf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper(&local_3f8);
      testing::Message::~Message((Message *)0x10daf1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10db49);
    local_40c = 0;
    local_410 = log_write_impl_va(auStack_a0[local_3d0 * 2 + -1],0xb0,"TestBody",
                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                  ,1,"hell yeah");
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffff4a8,
               (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
               (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_408);
    if (!bVar1) {
      testing::Message::Message(&local_418);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10dc38);
      testing::internal::AssertHelper::AssertHelper
                (&local_420,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xb0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_420,&local_418);
      testing::internal::AssertHelper::~AssertHelper(&local_420);
      testing::Message::~Message((Message *)0x10dc9b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10dcf0);
  }
  for (local_428 = 0; local_428 < 10; local_428 = local_428 + 1) {
    local_43c = 0;
    local_440 = log_write_impl_va(auStack_a0[local_428 * 2 + -1],0xba,"TestBody",
                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                  ,1,"hello world from log (id : %zu)",local_428);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffff4a8,
               (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
               (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_438);
    if (!bVar1) {
      testing::Message::Message(&local_448);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10de1c);
      testing::internal::AssertHelper::AssertHelper
                (&local_450,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xba,pcVar3);
      testing::internal::AssertHelper::operator=(&local_450,&local_448);
      testing::internal::AssertHelper::~AssertHelper(&local_450);
      testing::Message::~Message((Message *)0x10de7f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ded7);
    local_464 = 0;
    local_468 = log_write_impl_va(0x40410300bcbe61d0,auStack_a0[local_428 * 2 + -1],0xbb,"TestBody",
                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                  ,1,"%zu %f",local_428 + 1);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffff4a8,
               (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
               (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_460);
    if (!bVar1) {
      testing::Message::Message(&local_470);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10dfda);
      testing::internal::AssertHelper::AssertHelper
                (&local_478,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xbb,pcVar3);
      testing::internal::AssertHelper::operator=(&local_478,&local_470);
      testing::internal::AssertHelper::~AssertHelper(&local_478);
      testing::Message::~Message((Message *)0x10e03d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e095);
    local_48c = 0;
    local_490 = log_write_impl_va(auStack_a0[local_428 * 2 + -1],0xbc,"TestBody",
                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                  ,1,"double log (id : %zu)",local_428 * 2);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffff4a8,
               (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
               (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_488);
    if (!bVar1) {
      testing::Message::Message(&local_498);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10e190);
      testing::internal::AssertHelper::AssertHelper
                (&local_4a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xbc,pcVar3);
      testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
      testing::internal::AssertHelper::~AssertHelper(&local_4a0);
      testing::Message::~Message((Message *)0x10e1f3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e248);
  }
  for (local_4a8 = 0; local_4a8 < 10; local_4a8 = local_4a8 + 1) {
    local_4bc = 0;
    local_4c0 = log_clear(auStack_a0[local_4a8 * 2 + -1]);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffff4a8,
               (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
               (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b8);
    if (!bVar1) {
      testing::Message::Message(&local_4c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10e349);
      testing::internal::AssertHelper::AssertHelper
                (&local_4d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xc6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
      testing::internal::AssertHelper::~AssertHelper(&local_4d0);
      testing::Message::~Message((Message *)0x10e3ac);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e401);
  }
  local_4e4 = 0;
  uVar4 = log_policy_format_text_flags(1);
  uVar5 = log_policy_schedule_sync();
  uVar6 = log_policy_storage_sequential();
  uVar7 = log_policy_stream_stdio(_stdout);
  local_4e8 = log_configure_impl("newline",4,uVar4,uVar5,uVar6,uVar7);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10e537);
    testing::internal::AssertHelper::AssertHelper
              (&local_4f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper(&local_4f8);
    testing::Message::~Message((Message *)0x10e59a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e5f2);
  local_50c = 0;
  local_510 = log_write_impl_va("newline",0xd2,"TestBody",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                ,1,"NEW LINE A");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_508);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10e6d4);
    testing::internal::AssertHelper::AssertHelper
              (&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_520,&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_520);
    testing::Message::~Message((Message *)0x10e737);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e78f);
  local_534 = 0;
  local_538 = log_write_impl_va("newline",0xd3,"TestBody",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                ,1,"NEW LINE B");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_530);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10e871);
    testing::internal::AssertHelper::AssertHelper
              (&local_548,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_548,&local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_548);
    testing::Message::~Message((Message *)0x10e8d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e92c);
  local_55c = 0;
  local_560 = log_write_impl_va("newline",0xd4,"TestBody",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                ,1,"hello world from log (id : %zu)",0x4d2);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_558);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10ea17);
    testing::internal::AssertHelper::AssertHelper
              (&local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_570,&local_568);
    testing::internal::AssertHelper::~AssertHelper(&local_570);
    testing::Message::~Message((Message *)0x10ea7a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ead2);
  local_584 = 0;
  local_588 = log_write_impl_va("newline",0xd5,"TestBody",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                ,1,"hello world from log (id : %zu)",0x1538);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_580);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10ebbd);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_598,&local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    testing::Message::~Message((Message *)0x10ec20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ec78);
  local_5ac = 0;
  uVar4 = log_policy_format_text_flags();
  uVar5 = log_policy_schedule_sync();
  uVar6 = log_policy_storage_sequential();
  uVar7 = log_policy_stream_stdio(_stdout);
  local_5b0 = log_configure_impl("nonewline",4,uVar4,uVar5,uVar6,uVar7);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10ed9e);
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xdb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::Message::~Message((Message *)0x10ee01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ee59);
  local_5d4 = 0;
  local_5d8 = log_write_impl_va("nonewline",0xdd,"TestBody",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                ,1,"NO NEW LINE A");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10ef3b);
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xdd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    testing::Message::~Message((Message *)0x10ef9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10eff6);
  local_5fc = 0;
  local_600 = log_write_impl_va("nonewline",0xde,"TestBody",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                ,1,"NO NEW LINE B");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10f0cc);
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xde,pcVar3);
    testing::internal::AssertHelper::operator=(&local_610,&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    testing::Message::~Message((Message *)0x10f129);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f181);
  local_624 = 0;
  local_628 = log_write_impl_va("nonewline",0xdf,"TestBody",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                ,1,"hello world from log (id : %zu)",0x4d2);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_620);
  if (!bVar1) {
    testing::Message::Message(&local_630);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10f260);
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xdf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_638,&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    testing::Message::~Message((Message *)0x10f2bd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f315);
  local_64c = 0;
  local_650 = log_write_impl_va("nonewline",0xe0,"TestBody",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                                ,1,"hello world from log (id : %zu)",0x1538);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_648);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10f3f4);
    testing::internal::AssertHelper::AssertHelper
              (&local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xe0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_660,&local_658);
    testing::internal::AssertHelper::~AssertHelper(&local_660);
    testing::Message::~Message((Message *)0x10f451);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f4a6);
  local_674 = 0;
  local_678 = log_clear("newline");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
             (int *)in_stack_fffffffffffff498,(int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_670);
  if (!bVar1) {
    testing::Message::Message(&local_680);
    in_stack_fffffffffffff4a8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10f55a);
    testing::internal::AssertHelper::AssertHelper
              (&local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xe2,in_stack_fffffffffffff4a8);
    testing::internal::AssertHelper::operator=(&local_688,&local_680);
    testing::internal::AssertHelper::~AssertHelper(&local_688);
    testing::Message::~Message((Message *)0x10f5b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f60c);
  local_69c = 0;
  local_6a0 = log_clear("nonewline");
  this_00 = &local_698;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff4a8,
             (char *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),(int *)this_00,
             (int *)in_stack_fffffffffffff490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_6a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10f6c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xe3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6b0,&local_6a8);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    testing::Message::~Message((Message *)0x10f71d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f772);
  return;
}

Assistant:

TEST_F(log_test, DefaultConstructor)
{
	struct log_name_list_type
	{
		const char *name;
		unsigned int value;
	} log_name_list[] = {
		{ "test_log_text_sync_seq_stdout", 0 },
		{ "test_log_text_sync_seq_stderr", 1 },
		{ "test_log_text_sync_seq_file", 2 },
		{ "test_log_text_sync_seq_syslog", 3 },
		{ "test_log_text_sync_seq_socket", 4 },
		{ "test_log_bin_async_bat_stdout", 5 },
		{ "test_log_bin_async_bat_stderr", 6 },
		{ "test_log_bin_async_bat_file", 7 },
		{ "test_log_bin_async_bat_syslog", 8 },
		{ "test_log_bin_async_bat_socket", 9 }
	};

	const size_t log_name_list_size = sizeof(log_name_list) / sizeof(log_name_list[0]);

	/* Log map */
	{
		size_t iterator;

		log_map_iterator map_iterator;

		log_map map = log_map_create((size_t)0x00000200);

		EXPECT_NE((log_map)NULL, (log_map)map);

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_map_insert(map, log_name_list[iterator].name, (const void *)&log_name_list[iterator].value));
		}

		EXPECT_EQ((size_t)log_name_list_size, (size_t)log_map_size(map));

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			const void *value_ptr = log_map_get(map, log_name_list[iterator].name);

			unsigned int value = *((unsigned int *)value_ptr);

			EXPECT_EQ((unsigned int)log_name_list[iterator].value, (unsigned int)value);
		}

		for (map_iterator = log_map_iterator_begin(map); log_map_iterator_end(map_iterator) != 0; log_map_iterator_next(map_iterator))
		{
			const char *key = log_map_iterator_key(map_iterator);

			const void *value_ptr = log_map_iterator_value(map_iterator);

			unsigned int value = *((unsigned int *)value_ptr);

			EXPECT_EQ((int)0, (int)strcmp(log_name_list[value].name, key));
		}

		EXPECT_EQ((int)log_map_destroy(map), (int)0);
	}

	/* Create logs */
	{
		size_t iterator;

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_create(log_name_list[iterator].name));
		}
	}

	/* Set policies */
	{
		const size_t storage_batch_size = ((size_t)0x00000010);

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[0].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_stdio(stdout)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[1].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_stdio(stderr)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[2].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_file(log_name_list[2].name, "a+")));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[3].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_syslog(log_name_list[3].name)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[4].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_socket("127.0.0.1", UINT16_C(0x0208))));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[5].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_stdio(stdout)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[6].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_stdio(stderr)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[7].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_file(log_name_list[7].name, "a+")));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[8].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_syslog(log_name_list[8].name)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[9].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_socket("127.0.0.1", UINT16_C(0x0209))));
	}

	/* Write simple logs */
	{
		size_t iterator;

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "hello world"));
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "hell yeah"));
		}
	}

	/* Write varidic logs */
	{
		size_t iterator;

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", iterator));
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "%" PRIuS " %f", iterator + 1, 34.02346));
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "double log (id : %" PRIuS ")", iterator * 2));
		}
	}

	/* Clear all logs */
	{
		size_t iterator;

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_clear(log_name_list[iterator].name));
		}
	}

	/* Policy format text flags */
	{
		EXPECT_EQ((int)0, (int)log_configure("newline",
							  log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_NEWLINE),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_stdio(stdout)));

		EXPECT_EQ((int)0, (int)log_write("newline", LOG_LEVEL_INFO, "NEW LINE A"));
		EXPECT_EQ((int)0, (int)log_write("newline", LOG_LEVEL_INFO, "NEW LINE B"));
		EXPECT_EQ((int)0, (int)log_write("newline", LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", 1234));
		EXPECT_EQ((int)0, (int)log_write("newline", LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", 5432));

		EXPECT_EQ((int)0, (int)log_configure("nonewline",
							  log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_EMPTY),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_stdio(stdout)));

		EXPECT_EQ((int)0, (int)log_write("nonewline", LOG_LEVEL_INFO, "NO NEW LINE A"));
		EXPECT_EQ((int)0, (int)log_write("nonewline", LOG_LEVEL_INFO, "NO NEW LINE B"));
		EXPECT_EQ((int)0, (int)log_write("nonewline", LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", 1234));
		EXPECT_EQ((int)0, (int)log_write("nonewline", LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", 5432));

		EXPECT_EQ((int)0, (int)log_clear("newline"));
		EXPECT_EQ((int)0, (int)log_clear("nonewline"));
	}
}